

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cc
# Opt level: O0

void __thiscall iqxmlrpc::Server::schedule_execute(Server *this,Packet *pkt,Server_connection *conn)

{
  Executor_factory_base *pEVar1;
  bool bVar2;
  int iVar3;
  Packet *this_00;
  string *psVar4;
  Request *pRVar5;
  Inet_addr *pIVar6;
  Method *this_01;
  reference_type n;
  Header *this_02;
  XHeaders *xheaders;
  undefined4 extraout_var;
  element_type *ic;
  Param_list *pPVar7;
  Auth_Plugin_base *in_RCX;
  Packet *pkt_1;
  auto_ptr<iqxmlrpc::Executor> executor_to_delete;
  Error_response *e;
  Response err_r;
  Exception *e_1;
  Response err_r_1;
  exception *e_2;
  Response err_r_2;
  Method *meth;
  Data mdata;
  scoped_ptr<iqxmlrpc::Request> req;
  undefined1 local_60 [8];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  authname;
  scoped_ptr<iqxmlrpc::http::Packet> packet;
  Executor *executor;
  Server_connection *conn_local;
  Packet *pkt_local;
  Server *this_local;
  Executor *this_03;
  
  boost::scoped_ptr<iqxmlrpc::http::Packet>::scoped_ptr
            ((scoped_ptr<iqxmlrpc::http::Packet> *)
             ((long)&authname.super_type.m_storage.dummy_ + 0x18),pkt);
  (anonymous_namespace)::authenticate_abi_cxx11_
            ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_60,(_anonymous_namespace_ *)pkt,(Packet *)this->impl->auth_plugin,in_RCX);
  this_00 = boost::scoped_ptr<iqxmlrpc::http::Packet>::operator->
                      ((scoped_ptr<iqxmlrpc::http::Packet> *)
                       ((long)&authname.super_type.m_storage.dummy_ + 0x18));
  psVar4 = http::Packet::content_abi_cxx11_(this_00);
  pRVar5 = parse_request(psVar4);
  boost::scoped_ptr<iqxmlrpc::Request>::scoped_ptr
            ((scoped_ptr<iqxmlrpc::Request> *)&mdata.server_face,pRVar5);
  pRVar5 = boost::scoped_ptr<iqxmlrpc::Request>::operator->
                     ((scoped_ptr<iqxmlrpc::Request> *)&mdata.server_face);
  psVar4 = Request::get_name_abi_cxx11_(pRVar5);
  std::__cxx11::string::string((string *)&meth,(string *)psVar4);
  pIVar6 = Server_connection::get_peer_addr(conn);
  iqnet::Inet_addr::Inet_addr((Inet_addr *)((long)&mdata.method_name.field_2 + 8),pIVar6);
  Server_feedback::Server_feedback((Server_feedback *)&mdata.peer_addr.impl_.pn,this);
  this_01 = Method_dispatcher_manager::create_method(&this->impl->disp_manager,(Data *)&meth);
  bVar2 = boost::
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator!((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)local_60);
  if (((bVar2 ^ 0xffU) & 1) != 0) {
    n = boost::
        optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        get((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)local_60);
    Method::authname(this_01,n);
  }
  this_02 = http::Packet::header(pkt);
  xheaders = Method::xheaders(this_01);
  http::Header::get_xheaders(this_02,xheaders);
  pEVar1 = this->impl->exec_factory;
  iVar3 = (*pEVar1->_vptr_Executor_factory_base[2])(pEVar1,this_01,this,conn);
  this_03 = (Executor *)CONCAT44(extraout_var,iVar3);
  ic = std::auto_ptr<iqxmlrpc::Interceptor>::get(&this->impl->interceptors);
  Executor::set_interceptors(this_03,ic);
  pRVar5 = boost::scoped_ptr<iqxmlrpc::Request>::operator->
                     ((scoped_ptr<iqxmlrpc::Request> *)&mdata.server_face);
  pPVar7 = Request::get_params(pRVar5);
  (*this_03->_vptr_Executor[2])(this_03,pPVar7);
  Method::Data::~Data((Data *)&meth);
  boost::scoped_ptr<iqxmlrpc::Request>::~scoped_ptr
            ((scoped_ptr<iqxmlrpc::Request> *)&mdata.server_face);
  boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)local_60);
  boost::scoped_ptr<iqxmlrpc::http::Packet>::~scoped_ptr
            ((scoped_ptr<iqxmlrpc::http::Packet> *)
             ((long)&authname.super_type.m_storage.dummy_ + 0x18));
  return;
}

Assistant:

void Server::schedule_execute( http::Packet* pkt, Server_connection* conn )
{
  using boost::scoped_ptr;
  using boost::optional;

  Executor* executor = 0;

  try {
    scoped_ptr<http::Packet> packet(pkt);
    optional<std::string> authname = authenticate(*pkt, impl->auth_plugin);
    scoped_ptr<Request> req( parse_request(packet->content()) );

    Method::Data mdata = {
      req->get_name(),
      conn->get_peer_addr(),
      Server_feedback(this)
    };

    Method* meth = impl->disp_manager.create_method( mdata );

    if (authname)
      meth->authname(authname.get());

    pkt->header()->get_xheaders(meth->xheaders());

    executor = impl->exec_factory->create( meth, this, conn );
    executor->set_interceptors(impl->interceptors.get());
    executor->execute( req->get_params() );
  }
  catch( const iqxmlrpc::http::Error_response& e )
  {
    log_err_msg( e.what() );
    std::auto_ptr<Executor> executor_to_delete(executor);
    http::Packet *pkt = new http::Packet(e);
    conn->schedule_response( pkt );
  }
  catch( const iqxmlrpc::Exception& e )
  {
    log_err_msg( std::string("Server: ") + e.what() );
    Response err_r( e.code(), e.what() );
    schedule_response( err_r, conn, executor );
  }
  catch( const std::exception& e )
  {
    log_err_msg( std::string("Server: ") + e.what() );
    Response err_r( -32500 /*application error*/, e.what() );
    schedule_response( err_r, conn, executor );
  }
  catch( ... )
  {
    log_err_msg( "Server: Unknown exception" );
    Response err_r( -32500  /*application error*/, "Unknown Error" );
    schedule_response( err_r, conn, executor );
  }
}